

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::
basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'V',_void>_>,_std::tuple<>,_std::tuple<>_>
::basic_command(basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>_>,_std::tuple<>,_std::tuple<>_>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *footer,
               tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>_>
               *flags,tuple<> *subcommands,tuple<> *arguments)

{
  tuple<> *arguments_local;
  tuple<> *subcommands_local;
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>_>
  *flags_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *footer_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header_local;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__V_,_void>_>,_std::tuple<>,_std::tuple<>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)header);
  std::__cxx11::string::string((string *)&this->m_footer,(string *)footer);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'V',_void>_>
  ::tuple(&this->m_flags,flags);
  return;
}

Assistant:

basic_command(
        String const &header, String const &footer, Flags const &flags,
        Subcommands const &subcommands, Arguments const &arguments) :
        m_header(header), m_footer(footer), m_flags(flags), m_subcommands(subcommands),
        m_arguments(arguments)
    {}